

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long_long uVar4;
  size_t err_code_1;
  undefined4 *puVar5;
  size_t err_code_2;
  ulong uVar6;
  size_t err_code;
  undefined4 *dst_00;
  
  sVar2 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  if (0xffffffffffffff88 < sVar2) {
    return sVar2;
  }
  ZVar1 = cctx->stage;
  if (ZVar1 == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  dst_00 = (undefined4 *)((long)dst + sVar2);
  uVar6 = dstCapacity - sVar2;
  puVar5 = dst_00;
  if (ZVar1 != ZSTDcs_ending) {
    if (ZVar1 == ZSTDcs_init) {
      sVar3 = ZSTD_writeFrameHeader(dst_00,uVar6,&cctx->appliedParams,0,0);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
      uVar6 = uVar6 - sVar3;
      cctx->stage = ZSTDcs_ongoing;
      puVar5 = (undefined4 *)(sVar3 + (long)dst_00);
    }
    if (uVar6 < 4) {
      return 0xffffffffffffffba;
    }
    *puVar5 = 1;
    uVar6 = uVar6 - 3;
    puVar5 = (undefined4 *)((long)puVar5 + 3);
  }
  if ((cctx->appliedParams).fParams.checksumFlag != 0) {
    if (uVar6 < 4) {
      return 0xffffffffffffffba;
    }
    uVar4 = ZSTD_XXH64_digest(&cctx->xxhState);
    *puVar5 = (int)uVar4;
    puVar5 = puVar5 + 1;
  }
  cctx->stage = ZSTDcs_created;
  uVar6 = (long)puVar5 - (long)dst_00;
  if (0xffffffffffffff88 < uVar6) {
    return uVar6;
  }
  uVar4 = cctx->pledgedSrcSizePlusOne;
  if ((cctx->appliedParams).fParams.contentSizeFlag == 0) {
    if (uVar4 == 0) goto LAB_00140bcc;
  }
  else if (uVar4 == 0) {
    __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x36bb,
                  "size_t ZSTD_compressEnd(ZSTD_CCtx *, void *, size_t, const void *, size_t)");
  }
  if (uVar4 != cctx->consumedSrcSize + 1) {
    return 0xffffffffffffffb8;
  }
LAB_00140bcc:
  return uVar6 + sVar2;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize);
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult);
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    return cSize + endResult;
}